

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::fpToString<float>(string *__return_storage_ptr__,float value,int precision)

{
  ostream *this;
  void *this_00;
  long lVar1;
  long lVar2;
  char *pcVar3;
  string local_1d0 [32];
  long local_1b0;
  size_t i;
  int local_194;
  ostringstream local_190 [8];
  ostringstream oss;
  int precision_local;
  float value_local;
  string *d;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_194 = (int)std::setprecision(precision);
  this = std::operator<<((ostream *)local_190,(_Setprecision)local_194);
  this_00 = (void *)std::ostream::operator<<(this,std::fixed);
  std::ostream::operator<<(this_00,value);
  i._3_1_ = 0;
  std::__cxx11::ostringstream::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)__return_storage_ptr__,0x30);
  local_1b0 = lVar1;
  if ((lVar1 != -1) && (lVar2 = std::__cxx11::string::size(), lVar1 != lVar2 + -1)) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    if (*pcVar3 == '.') {
      local_1b0 = local_1b0 + 1;
    }
    std::__cxx11::string::substr((ulong)local_1d0,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1d0);
    std::__cxx11::string::~string(local_1d0);
  }
  i._3_1_ = 1;
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string fpToString( T value, int precision ) {
    std::ostringstream oss;
    oss << std::setprecision( precision )
        << std::fixed
        << value;
    std::string d = oss.str();
    std::size_t i = d.find_last_not_of( '0' );
    if( i != std::string::npos && i != d.size()-1 ) {
        if( d[i] == '.' )
            i++;
        d = d.substr( 0, i+1 );
    }
    return d;
}